

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cpp
# Opt level: O1

BOOL __thiscall HashTbl::Init(HashTbl *this,uint cidHash)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Ident **__s;
  DictionaryStats *pDVar4;
  BOOL BVar5;
  uint cb;
  
  if (POPCOUNT(cidHash) != 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                       ,0x20,"(cidHash > 0 && 0 == (cidHash & (cidHash - 1)))",
                       "cidHash > 0 && 0 == (cidHash & (cidHash - 1))");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this->m_luMask = cidHash - 1;
  this->m_luCount = 0;
  cb = 0xffffffff;
  if (cidHash < 0x20000000) {
    cb = cidHash * 8;
  }
  BVar5 = 0;
  if (-1 < (int)cb && cidHash < 0x20000000) {
    __s = (Ident **)NoReleaseAllocator::Alloc(&this->m_noReleaseAllocator,cb);
    this->m_prgpidName = __s;
    BVar5 = 0;
    if (__s != (Ident **)0x0) {
      memset(__s,0,(ulong)cb);
      pDVar4 = DictionaryStats::Create("P7HashTbl",cidHash);
      this->stats = pDVar4;
      BVar5 = 1;
    }
  }
  return BVar5;
}

Assistant:

BOOL HashTbl::Init(uint cidHash)
{
    // cidHash must be a power of two
    Assert(cidHash > 0 && 0 == (cidHash & (cidHash - 1)));

    int32 cb;

    /* Allocate and clear the hash bucket table */
    m_luMask = cidHash - 1;
    m_luCount = 0;

    // (Bug 1117873 - Windows OS Bugs)
    // Prefast: Verify that cidHash * sizeof(Ident *) does not cause an integer overflow
    // NoReleaseAllocator( ) takes int32 - so check for LONG_MAX
    // Win8 730594 - Use intsafe function to check for overflow.
    uint cbTemp;
    if (FAILED(UIntMult(cidHash, sizeof(Ident *), &cbTemp)) || cbTemp > LONG_MAX)
        return FALSE;

    cb = cbTemp;
    if (nullptr == (m_prgpidName = (Ident **)m_noReleaseAllocator.Alloc(cb)))
        return FALSE;
    memset(m_prgpidName, 0, cb);

#if PROFILE_DICTIONARY
    stats = DictionaryStats::Create(typeid(this).name(), cidHash);
#endif

    return TRUE;
}